

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  long *plVar1;
  atomic_zu_t *paVar2;
  ctl_arena_stats_t *pcVar3;
  ctl_arena_t *ctl_arena;
  size_t sVar4;
  uint64_t uVar5;
  long lVar6;
  size_t *psVar7;
  ctl_arena_stats_t *pcVar8;
  mutex_prof_data_t *data;
  mutex_prof_data_t *sum;
  bool bVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  
  ctl_arena = arenas_i((ulong)i);
  ctl_arena_clear(ctl_arena);
  pcVar3 = ctl_arena->astats;
  arena_stats_merge(tsdn,arena,&ctl_arena->nthreads,&ctl_arena->dss,&ctl_arena->dirty_decay_ms,
                    &ctl_arena->muzzy_decay_ms,&ctl_arena->pactive,&ctl_arena->pdirty,
                    &ctl_arena->pmuzzy,&pcVar3->astats,pcVar3->bstats,pcVar3->lstats,pcVar3->estats)
  ;
  pcVar3 = ctl_arena->astats;
  sVar4 = pcVar3->allocated_small;
  uVar10 = pcVar3->nmalloc_small;
  uVar11 = pcVar3->ndalloc_small;
  uVar5 = pcVar3->nrequests_small;
  uVar12 = pcVar3->nfills_small;
  uVar13 = pcVar3->nflushes_small;
  psVar7 = sz_index2size_tab;
  for (lVar6 = 0x4ff; lVar6 != 0x787; lVar6 = lVar6 + 0x12) {
    sVar4 = sVar4 + *psVar7 * *(long *)((long)pcVar3 + lVar6 * 8 + -8);
    pcVar3->allocated_small = sVar4;
    plVar1 = (long *)((long)pcVar3 + lVar6 * 8 + -0x20);
    uVar10 = uVar10 + *plVar1;
    uVar11 = uVar11 + plVar1[1];
    pcVar3->nmalloc_small = uVar10;
    pcVar3->ndalloc_small = uVar11;
    uVar5 = uVar5 + *(long *)((long)pcVar3 + lVar6 * 8 + -0x10);
    pcVar3->nrequests_small = uVar5;
    paVar2 = &(pcVar3->astats).mapped + lVar6;
    uVar12 = uVar12 + paVar2->repr;
    uVar13 = uVar13 + paVar2[1].repr;
    pcVar3->nfills_small = uVar12;
    pcVar3->nflushes_small = uVar13;
    psVar7 = psVar7 + 1;
  }
  if (destroyed) {
    pcVar8 = ctl_sdarena->astats;
  }
  else {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + ctl_arena->nthreads;
    sVar4 = ctl_arena->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + ctl_arena->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar4;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + ctl_arena->pmuzzy;
    pcVar8 = ctl_sdarena->astats;
    (pcVar8->astats).mapped.repr = (pcVar3->astats).mapped.repr + (pcVar8->astats).mapped.repr;
    (pcVar8->astats).retained.repr = (pcVar3->astats).retained.repr + (pcVar8->astats).retained.repr
    ;
    (pcVar8->astats).extent_avail.repr =
         (pcVar3->astats).extent_avail.repr + (pcVar8->astats).extent_avail.repr;
  }
  (pcVar8->astats).decay_dirty.npurge.repr =
       (pcVar3->astats).decay_dirty.npurge.repr + (pcVar8->astats).decay_dirty.npurge.repr;
  (pcVar8->astats).decay_dirty.nmadvise.repr =
       (pcVar3->astats).decay_dirty.nmadvise.repr + (pcVar8->astats).decay_dirty.nmadvise.repr;
  (pcVar8->astats).decay_dirty.purged.repr =
       (pcVar3->astats).decay_dirty.purged.repr + (pcVar8->astats).decay_dirty.purged.repr;
  (pcVar8->astats).decay_muzzy.npurge.repr =
       (pcVar3->astats).decay_muzzy.npurge.repr + (pcVar8->astats).decay_muzzy.npurge.repr;
  (pcVar8->astats).decay_muzzy.nmadvise.repr =
       (pcVar3->astats).decay_muzzy.nmadvise.repr + (pcVar8->astats).decay_muzzy.nmadvise.repr;
  (pcVar8->astats).decay_muzzy.purged.repr =
       (pcVar3->astats).decay_muzzy.purged.repr + (pcVar8->astats).decay_muzzy.purged.repr;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data,(pcVar3->astats).mutex_prof_data);
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 1,(pcVar3->astats).mutex_prof_data + 1)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 2,(pcVar3->astats).mutex_prof_data + 2)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 3,(pcVar3->astats).mutex_prof_data + 3)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 4,(pcVar3->astats).mutex_prof_data + 4)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 5,(pcVar3->astats).mutex_prof_data + 5)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 6,(pcVar3->astats).mutex_prof_data + 6)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 7,(pcVar3->astats).mutex_prof_data + 7)
  ;
  malloc_mutex_prof_merge((pcVar8->astats).mutex_prof_data + 8,(pcVar3->astats).mutex_prof_data + 8)
  ;
  if (!destroyed) {
    (pcVar8->astats).base.repr = (pcVar3->astats).base.repr + (pcVar8->astats).base.repr;
    (pcVar8->astats).internal.repr = (pcVar3->astats).internal.repr + (pcVar8->astats).internal.repr
    ;
    (pcVar8->astats).resident.repr = (pcVar3->astats).resident.repr + (pcVar8->astats).resident.repr
    ;
    (pcVar8->astats).metadata_thp.repr =
         (pcVar3->astats).metadata_thp.repr + (pcVar8->astats).metadata_thp.repr;
    pcVar8->allocated_small = pcVar8->allocated_small + pcVar3->allocated_small;
  }
  uVar5 = pcVar3->ndalloc_small;
  pcVar8->nmalloc_small = pcVar8->nmalloc_small + pcVar3->nmalloc_small;
  pcVar8->ndalloc_small = pcVar8->ndalloc_small + uVar5;
  uVar5 = pcVar3->nfills_small;
  pcVar8->nrequests_small = pcVar3->nrequests_small + pcVar8->nrequests_small;
  pcVar8->nfills_small = uVar5 + pcVar8->nfills_small;
  pcVar8->nflushes_small = pcVar8->nflushes_small + pcVar3->nflushes_small;
  if (!destroyed) {
    (pcVar8->astats).allocated_large.repr =
         (pcVar3->astats).allocated_large.repr + (pcVar8->astats).allocated_large.repr;
  }
  (pcVar8->astats).nmalloc_large.repr =
       (pcVar3->astats).nmalloc_large.repr + (pcVar8->astats).nmalloc_large.repr;
  (pcVar8->astats).ndalloc_large.repr =
       (pcVar3->astats).ndalloc_large.repr + (pcVar8->astats).ndalloc_large.repr;
  (pcVar8->astats).nrequests_large.repr =
       (pcVar3->astats).nrequests_large.repr + (pcVar8->astats).nrequests_large.repr;
  (pcVar8->astats).tcache_bytes.repr =
       (pcVar3->astats).tcache_bytes.repr + (pcVar8->astats).tcache_bytes.repr;
  if (ctl_arena->arena_ind == 0) {
    (pcVar8->astats).uptime.ns = (pcVar3->astats).uptime.ns;
  }
  sum = &pcVar8->bstats[0].mutex_data;
  data = &pcVar3->bstats[0].mutex_data;
  lVar6 = 0x24;
  while( true ) {
    bVar9 = lVar6 == 0;
    lVar6 = lVar6 + -1;
    if (bVar9) break;
    uVar5 = data[-2].n_lock_ops;
    sum[-2].prev_owner =
         (tsdn_t *)
         ((long)&((data[-2].prev_owner)->tsd).
                 cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx +
         (long)(((sum[-2].prev_owner)->tsd).
                cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache + 0x12 + -0x15
               ) + 0xffffffffffffffd0U);
    sum[-2].n_lock_ops = sum[-2].n_lock_ops + uVar5;
    sum[-1].tot_wait_time.ns = sum[-1].tot_wait_time.ns + data[-1].tot_wait_time.ns;
    if (!destroyed) {
      sum[-1].max_wait_time.ns = sum[-1].max_wait_time.ns + data[-1].max_wait_time.ns;
    }
    uVar5 = data[-1].n_spin_acquired;
    sum[-1].n_wait_times = sum[-1].n_wait_times + data[-1].n_wait_times;
    sum[-1].n_spin_acquired = sum[-1].n_spin_acquired + uVar5;
    uVar5 = data[-1].n_owner_switches;
    *(long *)&sum[-1].max_n_thds = *(long *)&data[-1].max_n_thds + *(long *)&sum[-1].max_n_thds;
    sum[-1].n_owner_switches = uVar5 + sum[-1].n_owner_switches;
    if (!destroyed) {
      uVar5 = data[-1].n_lock_ops;
      sum[-1].prev_owner =
           (tsdn_t *)
           ((long)&((data[-1].prev_owner)->tsd).
                   cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx +
           (long)(((sum[-1].prev_owner)->tsd).
                  cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx.cache + 0x12 +
                 -0x15) + 0xffffffffffffffd0U);
      sum[-1].n_lock_ops = sum[-1].n_lock_ops + uVar5;
    }
    malloc_mutex_prof_merge(sum,data);
    sum = (mutex_prof_data_t *)&sum[2].n_wait_times;
    data = (mutex_prof_data_t *)&data[2].n_wait_times;
  }
  for (lVar6 = 0; lVar6 != 0x24c0; lVar6 = lVar6 + 0x30) {
    *(long *)((long)&pcVar8->lstats[0].nmalloc.repr + lVar6) =
         *(long *)((long)&pcVar3->lstats[0].nmalloc.repr + lVar6) +
         *(long *)((long)&pcVar8->lstats[0].nmalloc.repr + lVar6);
    *(long *)((long)&pcVar8->lstats[0].ndalloc.repr + lVar6) =
         *(long *)((long)&pcVar3->lstats[0].ndalloc.repr + lVar6) +
         *(long *)((long)&pcVar8->lstats[0].ndalloc.repr + lVar6);
    *(long *)((long)&pcVar8->lstats[0].nrequests.repr + lVar6) =
         *(long *)((long)&pcVar3->lstats[0].nrequests.repr + lVar6) +
         *(long *)((long)&pcVar8->lstats[0].nrequests.repr + lVar6);
    if (!destroyed) {
      plVar1 = (long *)((long)&pcVar8->lstats[0].curlextents + lVar6);
      *plVar1 = *plVar1 + *(long *)((long)&pcVar3->lstats[0].curlextents + lVar6);
    }
  }
  for (lVar6 = 0; lVar6 != 0x2550; lVar6 = lVar6 + 0x30) {
    *(long *)((long)&pcVar8->estats[0].ndirty.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].ndirty.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].ndirty.repr + lVar6);
    *(long *)((long)&pcVar8->estats[0].nmuzzy.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].nmuzzy.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].nmuzzy.repr + lVar6);
    *(long *)((long)&pcVar8->estats[0].nretained.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].nretained.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].nretained.repr + lVar6);
    *(long *)((long)&pcVar8->estats[0].dirty_bytes.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].dirty_bytes.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].dirty_bytes.repr + lVar6);
    *(long *)((long)&pcVar8->estats[0].muzzy_bytes.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].muzzy_bytes.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].muzzy_bytes.repr + lVar6);
    *(long *)((long)&pcVar8->estats[0].retained_bytes.repr + lVar6) =
         *(long *)((long)&pcVar3->estats[0].retained_bytes.repr + lVar6) +
         *(long *)((long)&pcVar8->estats[0].retained_bytes.repr + lVar6);
  }
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}